

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

StructDef * __thiscall flatbuffers::Parser::LookupCreateStruct(Parser *this,string *name)

{
  _Rb_tree_header *p_Var1;
  const_iterator cVar2;
  StructDef *e;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
                  *)this,name);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->structs_).dict._M_t._M_impl.super__Rb_tree_header)
  {
    e = (StructDef *)0x0;
  }
  else {
    e = *(StructDef **)(cVar2._M_node + 2);
  }
  if (e == (StructDef *)0x0) {
    e = (StructDef *)operator_new(0xf0);
    (e->super_Definition).name._M_dataplus._M_p = (pointer)&(e->super_Definition).name.field_2;
    (e->super_Definition).name._M_string_length = 0;
    (e->super_Definition).name.field_2._M_local_buf[0] = '\0';
    (e->super_Definition).doc_comment._M_dataplus._M_p =
         (pointer)&(e->super_Definition).doc_comment.field_2;
    (e->super_Definition).doc_comment._M_string_length = 0;
    (e->super_Definition).doc_comment.field_2._M_local_buf[0] = '\0';
    p_Var1 = &(e->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header;
    (e->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         _S_red;
    *(_Base_ptr *)
     ((long)&(e->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_header + 8)
         = (_Base_ptr)0x0;
    *(_Rb_tree_header **)
     ((long)&(e->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_header +
     0x10) = p_Var1;
    *(_Rb_tree_header **)
     ((long)&(e->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_header +
     0x18) = p_Var1;
    (e->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    (e->super_Definition).attributes.vec.
    super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (e->super_Definition).attributes.vec.
    super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (e->super_Definition).attributes.vec.
    super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (e->super_Definition).generated = false;
    p_Var1 = &(e->fields).dict._M_t._M_impl.super__Rb_tree_header;
    (e->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (e->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (e->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (e->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (e->fields).dict._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    (e->fields).vec.
    super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (e->fields).vec.
    super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (e->fields).vec.
    super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    e->fixed = false;
    e->predecl = true;
    e->sortbysize = true;
    e->minalign = 1;
    e->bytesize = 0;
    SymbolTable<flatbuffers::StructDef>::Add(&this->structs_,name,e);
    std::__cxx11::string::_M_assign((string *)e);
    e->predecl = true;
  }
  return e;
}

Assistant:

StructDef *Parser::LookupCreateStruct(const std::string &name) {
  auto struct_def = structs_.Lookup(name);
  if (!struct_def) {
    // Rather than failing, we create a "pre declared" StructDef, due to
    // circular references, and check for errors at the end of parsing.
    struct_def = new StructDef();
    structs_.Add(name, struct_def);
    struct_def->name = name;
    struct_def->predecl = true;
  }
  return struct_def;
}